

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlEntityDesc * htmlEntityValueLookup(uint value)

{
  uint local_18;
  uint i;
  uint value_local;
  
  local_18 = 0;
  while( true ) {
    if (0xfc < local_18) {
      return (htmlEntityDesc *)0x0;
    }
    if (value <= html40EntitiesTable[local_18].value) break;
    local_18 = local_18 + 1;
  }
  if (value < html40EntitiesTable[local_18].value) {
    return (htmlEntityDesc *)0x0;
  }
  return html40EntitiesTable + local_18;
}

Assistant:

const htmlEntityDesc *
htmlEntityValueLookup(unsigned int value) {
    unsigned int i;

    for (i = 0;i < (sizeof(html40EntitiesTable)/
                    sizeof(html40EntitiesTable[0]));i++) {
        if (html40EntitiesTable[i].value >= value) {
	    if (html40EntitiesTable[i].value > value)
		break;
            return((htmlEntityDescPtr) &html40EntitiesTable[i]);
	}
    }
    return(NULL);
}